

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int btreeInitPage(MemPage *pPage)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  u32 uVar5;
  uint uVar6;
  BtShared *pBVar7;
  u8 *puVar8;
  uint uVar9;
  u16 uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ushort uVar15;
  uint uVar16;
  ushort uVar17;
  ulong uVar18;
  
  pBVar7 = pPage->pBt;
  puVar8 = pPage->aData;
  bVar1 = pPage->hdrOffset;
  iVar11 = decodeFlags(pPage,(uint)puVar8[bVar1]);
  if (iVar11 == 0) {
    uVar5 = pBVar7->pageSize;
    pPage->maskPage = (short)uVar5 - 1;
    pPage->nOverflow = '\0';
    uVar6 = pBVar7->usableSize;
    bVar2 = pPage->childPtrSize;
    pPage->cellOffset = bVar1 + 8 + (ushort)bVar2;
    pPage->aDataEnd = puVar8 + (int)uVar6;
    pPage->aCellIdx = puVar8 + (ulong)((uint)bVar1 + (uint)bVar2) + 8;
    pPage->aDataOfst = puVar8 + bVar2;
    bVar3 = puVar8[(ulong)bVar1 + 5];
    bVar4 = puVar8[(ulong)bVar1 + 6];
    uVar15 = *(ushort *)(puVar8 + (ulong)bVar1 + 3) << 8 |
             *(ushort *)(puVar8 + (ulong)bVar1 + 3) >> 8;
    pPage->nCell = uVar15;
    if ((uVar5 - 8) / 6 < (uint)uVar15) {
      iVar11 = 0xefd1;
    }
    else {
      lVar14 = (ulong)((uint)bVar1 + (uint)bVar2) + 8;
      uVar12 = (int)lVar14 + (uint)uVar15 * 2;
      iVar11 = uVar6 - 4;
      if ((pBVar7->db->flags & 0x100000) == 0) {
LAB_00129065:
        uVar15 = *(ushort *)(puVar8 + (ulong)bVar1 + 1) << 8 |
                 *(ushort *)(puVar8 + (ulong)bVar1 + 1) >> 8;
        iVar13 = (uint)puVar8[(ulong)bVar1 + 7] +
                 (((uint)bVar3 * 0x100 + (uint)bVar4) - 1 & 0xffff) + 1;
        if (uVar15 != 0) {
          uVar9 = (uint)uVar15;
          if (uVar15 < uVar12) {
            iVar11 = 0xf004;
            goto LAB_00128fa9;
          }
          do {
            uVar16 = uVar9;
            if (iVar11 < (int)uVar16) {
              iVar11 = 0xf009;
              goto LAB_00128fa9;
            }
            uVar15 = *(ushort *)(puVar8 + uVar16) << 8 | *(ushort *)(puVar8 + uVar16) >> 8;
            uVar17 = *(ushort *)(puVar8 + (ulong)uVar16 + 2) << 8 |
                     *(ushort *)(puVar8 + (ulong)uVar16 + 2) >> 8;
            iVar13 = iVar13 + (uint)uVar17;
            uVar9 = (uint)uVar15;
          } while (uVar17 + uVar16 + 3 < (uint)uVar15);
          if (uVar15 != 0) {
            iVar11 = 0xf013;
            goto LAB_00128fa9;
          }
          if (uVar6 < uVar17 + uVar16) {
            iVar11 = 0xf017;
            goto LAB_00128fa9;
          }
        }
        if (iVar13 <= (int)uVar6) {
          pPage->nFree = (short)iVar13 - (short)uVar12;
          pPage->isInit = '\x01';
          return 0;
        }
        iVar11 = 0xf023;
      }
      else {
        if (pPage->leaf == '\0') {
          iVar11 = uVar6 - 5;
        }
        uVar18 = 0;
        do {
          if (pPage->nCell <= uVar18) {
            iVar11 = iVar11 + (uint)(pPage->leaf == '\0');
            goto LAB_00129065;
          }
          uVar15 = *(ushort *)(puVar8 + uVar18 * 2 + lVar14) << 8 |
                   *(ushort *)(puVar8 + uVar18 * 2 + lVar14) >> 8;
          if ((uVar15 < uVar12) || (iVar11 < (int)(uint)uVar15)) {
            iVar11 = 0xefed;
            goto LAB_00128fa9;
          }
          uVar10 = (*pPage->xCellSize)(pPage,puVar8 + uVar15);
          uVar18 = uVar18 + 1;
        } while ((int)((uint)uVar10 + (uint)uVar15) <= (int)uVar6);
        iVar11 = 0xeff2;
      }
    }
  }
  else {
    iVar11 = 0xefbe;
  }
LAB_00128fa9:
  iVar11 = sqlite3CorruptError(iVar11);
  return iVar11;
}

Assistant:

static int btreeInitPage(MemPage *pPage){
  int pc;            /* Address of a freeblock within pPage->aData[] */
  u8 hdr;            /* Offset to beginning of page header */
  u8 *data;          /* Equal to pPage->aData */
  BtShared *pBt;        /* The main btree structure */
  int usableSize;    /* Amount of usable space on each page */
  u16 cellOffset;    /* Offset from start of page to first cell pointer */
  int nFree;         /* Number of unused bytes on the page */
  int top;           /* First byte of the cell content area */
  int iCellFirst;    /* First allowable cell or freeblock offset */
  int iCellLast;     /* Last possible cell or freeblock offset */

  assert( pPage->pBt!=0 );
  assert( pPage->pBt->db!=0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->pgno==sqlite3PagerPagenumber(pPage->pDbPage) );
  assert( pPage == sqlite3PagerGetExtra(pPage->pDbPage) );
  assert( pPage->aData == sqlite3PagerGetData(pPage->pDbPage) );
  assert( pPage->isInit==0 );

  pBt = pPage->pBt;
  hdr = pPage->hdrOffset;
  data = pPage->aData;
  /* EVIDENCE-OF: R-28594-02890 The one-byte flag at offset 0 indicating
  ** the b-tree page type. */
  if( decodeFlags(pPage, data[hdr]) ){
    return SQLITE_CORRUPT_PGNO(pPage->pgno);
  }
  assert( pBt->pageSize>=512 && pBt->pageSize<=65536 );
  pPage->maskPage = (u16)(pBt->pageSize - 1);
  pPage->nOverflow = 0;
  usableSize = pBt->usableSize;
  pPage->cellOffset = cellOffset = hdr + 8 + pPage->childPtrSize;
  pPage->aDataEnd = &data[usableSize];
  pPage->aCellIdx = &data[cellOffset];
  pPage->aDataOfst = &data[pPage->childPtrSize];
  /* EVIDENCE-OF: R-58015-48175 The two-byte integer at offset 5 designates
  ** the start of the cell content area. A zero value for this integer is
  ** interpreted as 65536. */
  top = get2byteNotZero(&data[hdr+5]);
  /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
  ** number of cells on the page. */
  pPage->nCell = get2byte(&data[hdr+3]);
  if( pPage->nCell>MX_CELL(pBt) ){
    /* To many cells for a single page.  The page must be corrupt */
    return SQLITE_CORRUPT_PGNO(pPage->pgno);
  }
  testcase( pPage->nCell==MX_CELL(pBt) );
  /* EVIDENCE-OF: R-24089-57979 If a page contains no cells (which is only
  ** possible for a root page of a table that contains no rows) then the
  ** offset to the cell content area will equal the page size minus the
  ** bytes of reserved space. */
  assert( pPage->nCell>0 || top==usableSize || CORRUPT_DB );

  /* A malformed database page might cause us to read past the end
  ** of page when parsing a cell.  
  **
  ** The following block of code checks early to see if a cell extends
  ** past the end of a page boundary and causes SQLITE_CORRUPT to be 
  ** returned if it does.
  */
  iCellFirst = cellOffset + 2*pPage->nCell;
  iCellLast = usableSize - 4;
  if( pBt->db->flags & SQLITE_CellSizeCk ){
    int i;            /* Index into the cell pointer array */
    int sz;           /* Size of a cell */

    if( !pPage->leaf ) iCellLast--;
    for(i=0; i<pPage->nCell; i++){
      pc = get2byteAligned(&data[cellOffset+i*2]);
      testcase( pc==iCellFirst );
      testcase( pc==iCellLast );
      if( pc<iCellFirst || pc>iCellLast ){
        return SQLITE_CORRUPT_PGNO(pPage->pgno);
      }
      sz = pPage->xCellSize(pPage, &data[pc]);
      testcase( pc+sz==usableSize );
      if( pc+sz>usableSize ){
        return SQLITE_CORRUPT_PGNO(pPage->pgno);
      }
    }
    if( !pPage->leaf ) iCellLast++;
  }  

  /* Compute the total free space on the page
  ** EVIDENCE-OF: R-23588-34450 The two-byte integer at offset 1 gives the
  ** start of the first freeblock on the page, or is zero if there are no
  ** freeblocks. */
  pc = get2byte(&data[hdr+1]);
  nFree = data[hdr+7] + top;  /* Init nFree to non-freeblock free space */
  if( pc>0 ){
    u32 next, size;
    if( pc<iCellFirst ){
      /* EVIDENCE-OF: R-55530-52930 In a well-formed b-tree page, there will
      ** always be at least one cell before the first freeblock.
      */
      return SQLITE_CORRUPT_PGNO(pPage->pgno); 
    }
    while( 1 ){
      if( pc>iCellLast ){
        /* Freeblock off the end of the page */
        return SQLITE_CORRUPT_PGNO(pPage->pgno);
      }
      next = get2byte(&data[pc]);
      size = get2byte(&data[pc+2]);
      nFree = nFree + size;
      if( next<=pc+size+3 ) break;
      pc = next;
    }
    if( next>0 ){
      /* Freeblock not in ascending order */
      return SQLITE_CORRUPT_PGNO(pPage->pgno);
    }
    if( pc+size>(unsigned int)usableSize ){
      /* Last freeblock extends past page end */
      return SQLITE_CORRUPT_PGNO(pPage->pgno);
    }
  }

  /* At this point, nFree contains the sum of the offset to the start
  ** of the cell-content area plus the number of free bytes within
  ** the cell-content area. If this is greater than the usable-size
  ** of the page, then the page must be corrupted. This check also
  ** serves to verify that the offset to the start of the cell-content
  ** area, according to the page header, lies within the page.
  */
  if( nFree>usableSize ){
    return SQLITE_CORRUPT_PGNO(pPage->pgno);
  }
  pPage->nFree = (u16)(nFree - iCellFirst);
  pPage->isInit = 1;
  return SQLITE_OK;
}